

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

Mat3x3d * __thiscall OpenMD::Thermo::getBoundingBox(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  Snapshot *this_00;
  Molecule *pMVar4;
  pointer ppAVar5;
  long lVar6;
  int i_1;
  Atom *pAVar7;
  pointer ppRVar8;
  int iVar9;
  RigidBody *this_01;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  Vector3d bMin;
  Vector3d bMax;
  MoleculeIterator i;
  Vector3d pos;
  Mat3x3d bBox;
  double local_e8 [4];
  double local_c8 [4];
  Mat3x3d *local_a8;
  MoleculeIterator local_a0;
  double local_98 [4];
  Mat3x3d local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasBoundingBox == false) {
    iVar9 = 0;
    local_a0._M_node = (_Base_ptr)0x0;
    local_98[2] = 0.0;
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_c8[2] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_e8[2] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_a8 = __return_storage_ptr__;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_a0);
    if (pMVar4 != (Molecule *)0x0) {
      do {
        ppRVar8 = (pMVar4->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppRVar8 ==
            (pMVar4->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this_01 = (RigidBody *)0x0;
        }
        else {
          this_01 = *ppRVar8;
        }
        while (this_01 != (RigidBody *)0x0) {
          ppRVar8 = ppRVar8 + 1;
          RigidBody::updateAtoms(this_01);
          if (ppRVar8 ==
              (pMVar4->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_01 = (RigidBody *)0x0;
          }
          else {
            this_01 = *ppRVar8;
          }
        }
        ppAVar5 = (pMVar4->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppAVar5 ==
            (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar7 = (Atom *)0x0;
        }
        else {
          pAVar7 = *ppAVar5;
        }
        while (pAVar7 != (Atom *)0x0) {
          lVar10 = (long)(pAVar7->super_StuntDouble).localIndex_;
          lVar6 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar7->super_StuntDouble).storage_);
          local_98[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar10 * 0x18);
          pdVar1 = (double *)(lVar6 + lVar10 * 0x18);
          local_98[0] = *pdVar1;
          local_98[1] = pdVar1[1];
          if (iVar9 == 0) {
            pdVar1 = (double *)(lVar6 + lVar10 * 0x18);
            local_c8[2] = pdVar1[2];
            local_c8[0] = *pdVar1;
            local_c8[1] = pdVar1[1];
            local_e8[0] = *pdVar1;
            local_e8[1] = pdVar1[1];
            local_e8[2] = pdVar1[2];
          }
          else {
            lVar6 = 0;
            do {
              dVar2 = local_98[lVar6];
              uVar11 = SUB84(dVar2,0);
              uVar12 = (undefined4)((ulong)dVar2 >> 0x20);
              dVar13 = dVar2;
              if (dVar2 <= local_c8[lVar6]) {
                dVar13 = local_c8[lVar6];
              }
              dVar3 = local_e8[lVar6];
              if (dVar3 <= dVar2) {
                uVar11 = SUB84(dVar3,0);
                uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
              }
              local_c8[lVar6] = dVar13;
              local_e8[lVar6] = (double)CONCAT44(uVar12,uVar11);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 3);
          }
          ppAVar5 = ppAVar5 + 1;
          if (ppAVar5 ==
              (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pAVar7 = (Atom *)0x0;
          }
          else {
            pAVar7 = *ppAVar5;
          }
          iVar9 = iVar9 + 1;
        }
        pMVar4 = SimInfo::nextMolecule(this->info_,&local_a0);
      } while (pMVar4 != (Molecule *)0x0);
    }
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    lVar6 = 0;
    do {
      *(double *)
       ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar6 * 4) = *(double *)((long)local_c8 + lVar6) - *(double *)((long)local_e8 + lVar6);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
    Snapshot::setBoundingBox(this_00,&local_78);
    __return_storage_ptr__ = local_a8;
  }
  Snapshot::getBoundingBox(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getBoundingBox() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasBoundingBox)) {
      SimInfo::MoleculeIterator i;
      Molecule::RigidBodyIterator ri;
      Molecule::AtomIterator ai;
      Molecule* mol;
      RigidBody* rb;
      Atom* atom;
      Vector3d pos, bMax, bMin;
      int index = 0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        // change the positions of atoms which belong to the rigidbodies
        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->updateAtoms();
        }

        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          pos = atom->getPos();

          if (index == 0) {
            bMax = pos;
            bMin = pos;
          } else {
            for (int i = 0; i < 3; i++) {
              bMax[i] = max(bMax[i], pos[i]);
              bMin[i] = min(bMin[i], pos[i]);
            }
          }
          index++;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &bMax[0], 3, MPI_REALTYPE, MPI_MAX,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &bMin[0], 3, MPI_REALTYPE, MPI_MIN,
                    MPI_COMM_WORLD);
#endif
      Mat3x3d bBox = Mat3x3d(0.0);
      for (int i = 0; i < 3; i++) {
        bBox(i, i) = bMax[i] - bMin[i];
      }
      snap->setBoundingBox(bBox);
    }

    return snap->getBoundingBox();
  }